

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O2

void __thiscall
google::protobuf::io::CodedOutputStream::WriteVarint64(CodedOutputStream *this,uint64 value)

{
  uint8 *target;
  int iVar1;
  uint8 *puVar2;
  
  if (9 < this->buffer_size_) {
    target = this->buffer_;
    puVar2 = WriteVarint64ToArray(value,target);
    iVar1 = (int)puVar2 - (int)target;
    this->buffer_ = this->buffer_ + iVar1;
    this->buffer_size_ = this->buffer_size_ - iVar1;
    return;
  }
  WriteVarint64SlowPath(this,value);
  return;
}

Assistant:

inline void CodedOutputStream::WriteVarint64(uint64 value) {
  if (buffer_size_ >= 10) {
    // Fast path:  We have enough bytes left in the buffer to guarantee that
    // this write won't cross the end, so we can skip the checks.
    uint8* target = buffer_;
    uint8* end = WriteVarint64ToArray(value, target);
    int size = static_cast<int>(end - target);
    Advance(size);
  } else {
    WriteVarint64SlowPath(value);
  }
}